

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

bool __thiscall miniscript::Node<unsigned_int>::IsSane(Node<unsigned_int> *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsValid(this);
  bVar4 = false;
  if ((bVar3) && (bVar4 = false, ((this->typ).m_flags & 1) != 0)) {
    bVar4 = ValidSatisfactions(this);
    if ((bVar4) && (uVar1 = (this->typ).m_flags, (~uVar1 & 0x41000) == 0)) {
      bVar4 = false;
      if (((this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == true) &&
         (((this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload._M_value & 1U) == 0)) {
        bVar4 = (bool)((byte)(uVar1 >> 0xb) & 1);
      }
    }
    else {
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSane() const { return IsValidTopLevel() && IsSaneSubexpression() && NeedsSignature(); }